

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DExporter::Export_MetadataBoolean
          (X3DExporter *this,aiString *pKey,bool pValue,size_t pTabLevel)

{
  pointer pcVar1;
  _Node *p_Var2;
  char *pcVar3;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  allocator local_89;
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  local_88;
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  char local_40 [16];
  
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node._M_size = 0;
  pcVar1 = local_70 + 0x10;
  local_88._M_impl._M_node.super__List_node_base._M_prev =
       local_88._M_impl._M_node.super__List_node_base._M_next;
  local_70._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"name","");
  std::__cxx11::string::string((string *)&local_50,pKey->data,&local_89);
  p_Var2 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           _M_create_node<Assimp::X3DExporter::SAttribute>
                     ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_88,(SAttribute *)local_70);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  local_88._M_impl._M_node._M_size = local_88._M_impl._M_node._M_size + 1;
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if ((pointer)local_70._0_8_ != pcVar1) {
    operator_delete((void *)local_70._0_8_);
  }
  local_70._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"value","");
  pcVar3 = "false";
  if (pValue) {
    pcVar3 = "true";
  }
  local_50._M_p = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,pcVar3,pcVar3 + ((ulong)pValue ^ 5));
  p_Var2 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           _M_create_node<Assimp::X3DExporter::SAttribute>
                     ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_88,(SAttribute *)local_70);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  local_88._M_impl._M_node._M_size = local_88._M_impl._M_node._M_size + 1;
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if ((pointer)local_70._0_8_ != pcVar1) {
    operator_delete((void *)local_70._0_8_);
  }
  local_70._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"MetadataBoolean","");
  NodeHelper_OpenNode(this,(string *)local_70,pTabLevel,true,
                      (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_88);
  if ((pointer)local_70._0_8_ != pcVar1) {
    operator_delete((void *)local_70._0_8_);
  }
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&local_88);
  return;
}

Assistant:

void X3DExporter::Export_MetadataBoolean(const aiString& pKey, const bool pValue, const size_t pTabLevel)
{
list<SAttribute> attr_list;

	attr_list.push_back({"name", pKey.C_Str()});
	attr_list.push_back({"value", pValue ? "true" : "false"});
	NodeHelper_OpenNode("MetadataBoolean", pTabLevel, true, attr_list);
}